

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_heap_scatter.cpp
# Opt level: O2

void duckdb::RowOperations::HeapScatterVData
               (UnifiedVectorFormat *vdata,PhysicalType type,SelectionVector *sel,idx_t ser_count,
               data_ptr_t *key_locations,optional_ptr<duckdb::NestedValidity,_true> parent_validity,
               idx_t offset)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  sel_t *psVar3;
  data_ptr_t pdVar4;
  int iVar5;
  undefined8 uVar6;
  bool bVar7;
  idx_t i_1;
  NestedValidity *pNVar8;
  NotImplementedException *this;
  ulong uVar9;
  idx_t i;
  idx_t iVar10;
  undefined7 in_register_00000031;
  idx_t iVar11;
  allocator local_51;
  string local_50;
  
  iVar5 = (int)CONCAT71(in_register_00000031,type);
  local_50._M_dataplus._M_p = (pointer)parent_validity.ptr;
  switch(iVar5) {
  case 1:
  case 3:
    pdVar2 = vdata->data;
    if (parent_validity.ptr == (NestedValidity *)0x0) {
      for (iVar10 = 0; ser_count != iVar10; iVar10 = iVar10 + 1) {
        iVar11 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar11 = (idx_t)sel->sel_vector[iVar10];
        }
        uVar9 = iVar11 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          uVar9 = (ulong)psVar3[uVar9];
        }
        *key_locations[iVar10] = pdVar2[uVar9];
        key_locations[iVar10] = key_locations[iVar10] + 1;
      }
    }
    else {
      for (iVar10 = 0; ser_count != iVar10; iVar10 = iVar10 + 1) {
        iVar11 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar11 = (idx_t)sel->sel_vector[iVar10];
        }
        iVar11 = iVar11 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar3[iVar11];
        }
        *key_locations[iVar10] = pdVar2[iVar11];
        key_locations[iVar10] = key_locations[iVar10] + 1;
        bVar7 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&(vdata->validity).super_TemplatedValidityMask<unsigned_long>,iVar11);
        if (!bVar7) {
          pNVar8 = optional_ptr<duckdb::NestedValidity,_true>::operator->
                             ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
          NestedValidity::SetInvalid(pNVar8,iVar10);
        }
      }
    }
    break;
  case 2:
    pdVar2 = vdata->data;
    if (parent_validity.ptr == (NestedValidity *)0x0) {
      for (iVar10 = 0; ser_count != iVar10; iVar10 = iVar10 + 1) {
        iVar11 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar11 = (idx_t)sel->sel_vector[iVar10];
        }
        uVar9 = iVar11 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          uVar9 = (ulong)psVar3[uVar9];
        }
        *key_locations[iVar10] = pdVar2[uVar9];
        key_locations[iVar10] = key_locations[iVar10] + 1;
      }
    }
    else {
      for (iVar10 = 0; ser_count != iVar10; iVar10 = iVar10 + 1) {
        iVar11 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar11 = (idx_t)sel->sel_vector[iVar10];
        }
        iVar11 = iVar11 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar3[iVar11];
        }
        *key_locations[iVar10] = pdVar2[iVar11];
        key_locations[iVar10] = key_locations[iVar10] + 1;
        bVar7 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&(vdata->validity).super_TemplatedValidityMask<unsigned_long>,iVar11);
        if (!bVar7) {
          pNVar8 = optional_ptr<duckdb::NestedValidity,_true>::operator->
                             ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
          NestedValidity::SetInvalid(pNVar8,iVar10);
        }
      }
    }
    break;
  case 4:
    pdVar2 = vdata->data;
    if (parent_validity.ptr == (NestedValidity *)0x0) {
      for (iVar10 = 0; ser_count != iVar10; iVar10 = iVar10 + 1) {
        iVar11 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar11 = (idx_t)sel->sel_vector[iVar10];
        }
        uVar9 = iVar11 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          uVar9 = (ulong)psVar3[uVar9];
        }
        *(undefined2 *)key_locations[iVar10] = *(undefined2 *)(pdVar2 + uVar9 * 2);
        key_locations[iVar10] = key_locations[iVar10] + 2;
      }
    }
    else {
      for (iVar10 = 0; ser_count != iVar10; iVar10 = iVar10 + 1) {
        iVar11 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar11 = (idx_t)sel->sel_vector[iVar10];
        }
        iVar11 = iVar11 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar3[iVar11];
        }
        *(undefined2 *)key_locations[iVar10] = *(undefined2 *)(pdVar2 + iVar11 * 2);
        key_locations[iVar10] = key_locations[iVar10] + 2;
        bVar7 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&(vdata->validity).super_TemplatedValidityMask<unsigned_long>,iVar11);
        if (!bVar7) {
          pNVar8 = optional_ptr<duckdb::NestedValidity,_true>::operator->
                             ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
          NestedValidity::SetInvalid(pNVar8,iVar10);
        }
      }
    }
    break;
  case 5:
    pdVar2 = vdata->data;
    if (parent_validity.ptr == (NestedValidity *)0x0) {
      for (iVar10 = 0; ser_count != iVar10; iVar10 = iVar10 + 1) {
        iVar11 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar11 = (idx_t)sel->sel_vector[iVar10];
        }
        uVar9 = iVar11 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          uVar9 = (ulong)psVar3[uVar9];
        }
        *(undefined2 *)key_locations[iVar10] = *(undefined2 *)(pdVar2 + uVar9 * 2);
        key_locations[iVar10] = key_locations[iVar10] + 2;
      }
    }
    else {
      for (iVar10 = 0; ser_count != iVar10; iVar10 = iVar10 + 1) {
        iVar11 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar11 = (idx_t)sel->sel_vector[iVar10];
        }
        iVar11 = iVar11 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar3[iVar11];
        }
        *(undefined2 *)key_locations[iVar10] = *(undefined2 *)(pdVar2 + iVar11 * 2);
        key_locations[iVar10] = key_locations[iVar10] + 2;
        bVar7 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&(vdata->validity).super_TemplatedValidityMask<unsigned_long>,iVar11);
        if (!bVar7) {
          pNVar8 = optional_ptr<duckdb::NestedValidity,_true>::operator->
                             ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
          NestedValidity::SetInvalid(pNVar8,iVar10);
        }
      }
    }
    break;
  case 6:
    pdVar2 = vdata->data;
    if (parent_validity.ptr == (NestedValidity *)0x0) {
      for (iVar10 = 0; ser_count != iVar10; iVar10 = iVar10 + 1) {
        iVar11 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar11 = (idx_t)sel->sel_vector[iVar10];
        }
        uVar9 = iVar11 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          uVar9 = (ulong)psVar3[uVar9];
        }
        *(undefined4 *)key_locations[iVar10] = *(undefined4 *)(pdVar2 + uVar9 * 4);
        key_locations[iVar10] = key_locations[iVar10] + 4;
      }
    }
    else {
      for (iVar10 = 0; ser_count != iVar10; iVar10 = iVar10 + 1) {
        iVar11 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar11 = (idx_t)sel->sel_vector[iVar10];
        }
        iVar11 = iVar11 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar3[iVar11];
        }
        *(undefined4 *)key_locations[iVar10] = *(undefined4 *)(pdVar2 + iVar11 * 4);
        key_locations[iVar10] = key_locations[iVar10] + 4;
        bVar7 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&(vdata->validity).super_TemplatedValidityMask<unsigned_long>,iVar11);
        if (!bVar7) {
          pNVar8 = optional_ptr<duckdb::NestedValidity,_true>::operator->
                             ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
          NestedValidity::SetInvalid(pNVar8,iVar10);
        }
      }
    }
    break;
  case 7:
    pdVar2 = vdata->data;
    if (parent_validity.ptr == (NestedValidity *)0x0) {
      for (iVar10 = 0; ser_count != iVar10; iVar10 = iVar10 + 1) {
        iVar11 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar11 = (idx_t)sel->sel_vector[iVar10];
        }
        uVar9 = iVar11 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          uVar9 = (ulong)psVar3[uVar9];
        }
        *(undefined4 *)key_locations[iVar10] = *(undefined4 *)(pdVar2 + uVar9 * 4);
        key_locations[iVar10] = key_locations[iVar10] + 4;
      }
    }
    else {
      for (iVar10 = 0; ser_count != iVar10; iVar10 = iVar10 + 1) {
        iVar11 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar11 = (idx_t)sel->sel_vector[iVar10];
        }
        iVar11 = iVar11 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar3[iVar11];
        }
        *(undefined4 *)key_locations[iVar10] = *(undefined4 *)(pdVar2 + iVar11 * 4);
        key_locations[iVar10] = key_locations[iVar10] + 4;
        bVar7 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&(vdata->validity).super_TemplatedValidityMask<unsigned_long>,iVar11);
        if (!bVar7) {
          pNVar8 = optional_ptr<duckdb::NestedValidity,_true>::operator->
                             ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
          NestedValidity::SetInvalid(pNVar8,iVar10);
        }
      }
    }
    break;
  case 8:
    pdVar2 = vdata->data;
    if (parent_validity.ptr == (NestedValidity *)0x0) {
      for (iVar10 = 0; ser_count != iVar10; iVar10 = iVar10 + 1) {
        iVar11 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar11 = (idx_t)sel->sel_vector[iVar10];
        }
        uVar9 = iVar11 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          uVar9 = (ulong)psVar3[uVar9];
        }
        *(undefined8 *)key_locations[iVar10] = *(undefined8 *)(pdVar2 + uVar9 * 8);
        key_locations[iVar10] = key_locations[iVar10] + 8;
      }
    }
    else {
      for (iVar10 = 0; ser_count != iVar10; iVar10 = iVar10 + 1) {
        iVar11 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar11 = (idx_t)sel->sel_vector[iVar10];
        }
        iVar11 = iVar11 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar3[iVar11];
        }
        *(undefined8 *)key_locations[iVar10] = *(undefined8 *)(pdVar2 + iVar11 * 8);
        key_locations[iVar10] = key_locations[iVar10] + 8;
        bVar7 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&(vdata->validity).super_TemplatedValidityMask<unsigned_long>,iVar11);
        if (!bVar7) {
          pNVar8 = optional_ptr<duckdb::NestedValidity,_true>::operator->
                             ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
          NestedValidity::SetInvalid(pNVar8,iVar10);
        }
      }
    }
    break;
  case 9:
    pdVar2 = vdata->data;
    if (parent_validity.ptr == (NestedValidity *)0x0) {
      for (iVar10 = 0; ser_count != iVar10; iVar10 = iVar10 + 1) {
        iVar11 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar11 = (idx_t)sel->sel_vector[iVar10];
        }
        uVar9 = iVar11 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          uVar9 = (ulong)psVar3[uVar9];
        }
        *(undefined8 *)key_locations[iVar10] = *(undefined8 *)(pdVar2 + uVar9 * 8);
        key_locations[iVar10] = key_locations[iVar10] + 8;
      }
    }
    else {
      for (iVar10 = 0; ser_count != iVar10; iVar10 = iVar10 + 1) {
        iVar11 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar11 = (idx_t)sel->sel_vector[iVar10];
        }
        iVar11 = iVar11 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar3[iVar11];
        }
        *(undefined8 *)key_locations[iVar10] = *(undefined8 *)(pdVar2 + iVar11 * 8);
        key_locations[iVar10] = key_locations[iVar10] + 8;
        bVar7 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&(vdata->validity).super_TemplatedValidityMask<unsigned_long>,iVar11);
        if (!bVar7) {
          pNVar8 = optional_ptr<duckdb::NestedValidity,_true>::operator->
                             ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
          NestedValidity::SetInvalid(pNVar8,iVar10);
        }
      }
    }
    break;
  case 10:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
switchD_0167dca0_caseD_a:
    this = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_50,"FIXME: Serialize to of constant type column to row-format",
               &local_51);
    NotImplementedException::NotImplementedException(this,&local_50);
    __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case 0xb:
    pdVar2 = vdata->data;
    if (parent_validity.ptr == (NestedValidity *)0x0) {
      for (iVar10 = 0; ser_count != iVar10; iVar10 = iVar10 + 1) {
        iVar11 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar11 = (idx_t)sel->sel_vector[iVar10];
        }
        uVar9 = iVar11 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          uVar9 = (ulong)psVar3[uVar9];
        }
        *(undefined4 *)key_locations[iVar10] = *(undefined4 *)(pdVar2 + uVar9 * 4);
        key_locations[iVar10] = key_locations[iVar10] + 4;
      }
    }
    else {
      for (iVar10 = 0; ser_count != iVar10; iVar10 = iVar10 + 1) {
        iVar11 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar11 = (idx_t)sel->sel_vector[iVar10];
        }
        iVar11 = iVar11 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar3[iVar11];
        }
        *(undefined4 *)key_locations[iVar10] = *(undefined4 *)(pdVar2 + iVar11 * 4);
        key_locations[iVar10] = key_locations[iVar10] + 4;
        bVar7 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&(vdata->validity).super_TemplatedValidityMask<unsigned_long>,iVar11);
        if (!bVar7) {
          pNVar8 = optional_ptr<duckdb::NestedValidity,_true>::operator->
                             ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
          NestedValidity::SetInvalid(pNVar8,iVar10);
        }
      }
    }
    break;
  case 0xc:
    pdVar2 = vdata->data;
    if (parent_validity.ptr == (NestedValidity *)0x0) {
      for (iVar10 = 0; ser_count != iVar10; iVar10 = iVar10 + 1) {
        iVar11 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar11 = (idx_t)sel->sel_vector[iVar10];
        }
        uVar9 = iVar11 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          uVar9 = (ulong)psVar3[uVar9];
        }
        *(undefined8 *)key_locations[iVar10] = *(undefined8 *)(pdVar2 + uVar9 * 8);
        key_locations[iVar10] = key_locations[iVar10] + 8;
      }
    }
    else {
      for (iVar10 = 0; ser_count != iVar10; iVar10 = iVar10 + 1) {
        iVar11 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar11 = (idx_t)sel->sel_vector[iVar10];
        }
        iVar11 = iVar11 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar3[iVar11];
        }
        *(undefined8 *)key_locations[iVar10] = *(undefined8 *)(pdVar2 + iVar11 * 8);
        key_locations[iVar10] = key_locations[iVar10] + 8;
        bVar7 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&(vdata->validity).super_TemplatedValidityMask<unsigned_long>,iVar11);
        if (!bVar7) {
          pNVar8 = optional_ptr<duckdb::NestedValidity,_true>::operator->
                             ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
          NestedValidity::SetInvalid(pNVar8,iVar10);
        }
      }
    }
    break;
  case 0x15:
    pdVar2 = vdata->data;
    if (parent_validity.ptr == (NestedValidity *)0x0) {
      for (iVar10 = 0; ser_count != iVar10; iVar10 = iVar10 + 1) {
        iVar11 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar11 = (idx_t)sel->sel_vector[iVar10];
        }
        uVar9 = iVar11 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          uVar9 = (ulong)psVar3[uVar9];
        }
        pdVar4 = key_locations[iVar10];
        pdVar1 = pdVar2 + uVar9 * 0x10;
        uVar6 = *(undefined8 *)(pdVar1 + 8);
        *(undefined8 *)pdVar4 = *(undefined8 *)pdVar1;
        *(undefined8 *)(pdVar4 + 8) = uVar6;
        key_locations[iVar10] = key_locations[iVar10] + 0x10;
      }
    }
    else {
      for (iVar10 = 0; ser_count != iVar10; iVar10 = iVar10 + 1) {
        iVar11 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar11 = (idx_t)sel->sel_vector[iVar10];
        }
        iVar11 = iVar11 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar3[iVar11];
        }
        pdVar4 = key_locations[iVar10];
        pdVar1 = pdVar2 + iVar11 * 0x10;
        uVar6 = *(undefined8 *)(pdVar1 + 8);
        *(undefined8 *)pdVar4 = *(undefined8 *)pdVar1;
        *(undefined8 *)(pdVar4 + 8) = uVar6;
        key_locations[iVar10] = key_locations[iVar10] + 0x10;
        bVar7 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&(vdata->validity).super_TemplatedValidityMask<unsigned_long>,iVar11);
        if (!bVar7) {
          pNVar8 = optional_ptr<duckdb::NestedValidity,_true>::operator->
                             ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
          NestedValidity::SetInvalid(pNVar8,iVar10);
        }
      }
    }
    break;
  default:
    if (iVar5 == 0xcb) {
      pdVar2 = vdata->data;
      if (parent_validity.ptr == (NestedValidity *)0x0) {
        for (iVar10 = 0; ser_count != iVar10; iVar10 = iVar10 + 1) {
          iVar11 = iVar10;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar11 = (idx_t)sel->sel_vector[iVar10];
          }
          uVar9 = iVar11 + offset;
          psVar3 = vdata->sel->sel_vector;
          if (psVar3 != (sel_t *)0x0) {
            uVar9 = (ulong)psVar3[uVar9];
          }
          pdVar4 = key_locations[iVar10];
          pdVar1 = pdVar2 + uVar9 * 0x10;
          uVar6 = *(undefined8 *)(pdVar1 + 8);
          *(undefined8 *)pdVar4 = *(undefined8 *)pdVar1;
          *(undefined8 *)(pdVar4 + 8) = uVar6;
          key_locations[iVar10] = key_locations[iVar10] + 0x10;
        }
      }
      else {
        for (iVar10 = 0; ser_count != iVar10; iVar10 = iVar10 + 1) {
          iVar11 = iVar10;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar11 = (idx_t)sel->sel_vector[iVar10];
          }
          iVar11 = iVar11 + offset;
          psVar3 = vdata->sel->sel_vector;
          if (psVar3 != (sel_t *)0x0) {
            iVar11 = (idx_t)psVar3[iVar11];
          }
          pdVar4 = key_locations[iVar10];
          pdVar1 = pdVar2 + iVar11 * 0x10;
          uVar6 = *(undefined8 *)(pdVar1 + 8);
          *(undefined8 *)pdVar4 = *(undefined8 *)pdVar1;
          *(undefined8 *)(pdVar4 + 8) = uVar6;
          key_locations[iVar10] = key_locations[iVar10] + 0x10;
          bVar7 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (&(vdata->validity).super_TemplatedValidityMask<unsigned_long>,iVar11);
          if (!bVar7) {
            pNVar8 = optional_ptr<duckdb::NestedValidity,_true>::operator->
                               ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
            NestedValidity::SetInvalid(pNVar8,iVar10);
          }
        }
      }
    }
    else {
      if (iVar5 != 0xcc) goto switchD_0167dca0_caseD_a;
      pdVar2 = vdata->data;
      if (parent_validity.ptr == (NestedValidity *)0x0) {
        for (iVar10 = 0; ser_count != iVar10; iVar10 = iVar10 + 1) {
          iVar11 = iVar10;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar11 = (idx_t)sel->sel_vector[iVar10];
          }
          uVar9 = iVar11 + offset;
          psVar3 = vdata->sel->sel_vector;
          if (psVar3 != (sel_t *)0x0) {
            uVar9 = (ulong)psVar3[uVar9];
          }
          pdVar4 = key_locations[iVar10];
          pdVar1 = pdVar2 + uVar9 * 0x10;
          uVar6 = *(undefined8 *)(pdVar1 + 8);
          *(undefined8 *)pdVar4 = *(undefined8 *)pdVar1;
          *(undefined8 *)(pdVar4 + 8) = uVar6;
          key_locations[iVar10] = key_locations[iVar10] + 0x10;
        }
      }
      else {
        for (iVar10 = 0; ser_count != iVar10; iVar10 = iVar10 + 1) {
          iVar11 = iVar10;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar11 = (idx_t)sel->sel_vector[iVar10];
          }
          iVar11 = iVar11 + offset;
          psVar3 = vdata->sel->sel_vector;
          if (psVar3 != (sel_t *)0x0) {
            iVar11 = (idx_t)psVar3[iVar11];
          }
          pdVar4 = key_locations[iVar10];
          pdVar1 = pdVar2 + iVar11 * 0x10;
          uVar6 = *(undefined8 *)(pdVar1 + 8);
          *(undefined8 *)pdVar4 = *(undefined8 *)pdVar1;
          *(undefined8 *)(pdVar4 + 8) = uVar6;
          key_locations[iVar10] = key_locations[iVar10] + 0x10;
          bVar7 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (&(vdata->validity).super_TemplatedValidityMask<unsigned_long>,iVar11);
          if (!bVar7) {
            pNVar8 = optional_ptr<duckdb::NestedValidity,_true>::operator->
                               ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
            NestedValidity::SetInvalid(pNVar8,iVar10);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void RowOperations::HeapScatterVData(UnifiedVectorFormat &vdata, PhysicalType type, const SelectionVector &sel,
                                     idx_t ser_count, data_ptr_t *key_locations,
                                     optional_ptr<NestedValidity> parent_validity, idx_t offset) {
	switch (type) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		TemplatedHeapScatter<int8_t>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	case PhysicalType::INT16:
		TemplatedHeapScatter<int16_t>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	case PhysicalType::INT32:
		TemplatedHeapScatter<int32_t>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	case PhysicalType::INT64:
		TemplatedHeapScatter<int64_t>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	case PhysicalType::UINT8:
		TemplatedHeapScatter<uint8_t>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	case PhysicalType::UINT16:
		TemplatedHeapScatter<uint16_t>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	case PhysicalType::UINT32:
		TemplatedHeapScatter<uint32_t>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	case PhysicalType::UINT64:
		TemplatedHeapScatter<uint64_t>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	case PhysicalType::INT128:
		TemplatedHeapScatter<hugeint_t>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	case PhysicalType::UINT128:
		TemplatedHeapScatter<uhugeint_t>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	case PhysicalType::FLOAT:
		TemplatedHeapScatter<float>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	case PhysicalType::DOUBLE:
		TemplatedHeapScatter<double>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	case PhysicalType::INTERVAL:
		TemplatedHeapScatter<interval_t>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	default:
		throw NotImplementedException("FIXME: Serialize to of constant type column to row-format");
	}
}